

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O0

void __thiscall DiskGen::Tick(DiskGen *this)

{
  int iVar1;
  int iVar2;
  bool local_2e;
  bool local_1d;
  uchar b_1;
  int dbg;
  uchar b;
  int nb_bit_read;
  DiskGen *this_local;
  
  if (((this->motor_on_ & 1U) == 0) && (this->final_speed_ != 1000000)) {
    this->motor_on_ = true;
    this->speed_change_counter_ = 0;
  }
  if (((this->disk_present_ & 1U) != 0) && ((this->motor_on_ & 1U) != 0)) {
    if (this->speed_change_counter_ == 0) {
      this->speed_change_counter_ = 1;
      if (this->current_speed_ < this->final_speed_) {
        this->current_speed_ = this->current_speed_ + 0x14;
        if (this->final_speed_ < this->current_speed_) {
          this->current_speed_ = this->final_speed_;
        }
        if (this->current_speed_ == 1000000) {
          this->motor_on_ = false;
        }
      }
      else {
        this->current_speed_ = this->current_speed_ + -0x14;
        if (this->current_speed_ < this->final_speed_) {
          this->current_speed_ = this->final_speed_;
        }
      }
      if ((this->motor_on_ & 1U) != 0) {
        iVar2 = this->current_speed_;
        iVar1 = IDisk::GetSizeOfTrack(this->disk_,this->current_side_,this->current_track_);
        this->time_for_one_bit_ = (float)iVar2 / (float)iVar1;
      }
    }
    else {
      this->speed_change_counter_ = this->speed_change_counter_ + -1;
    }
    if (3.0 < this->time_for_one_bit_) {
      this->time_for_one_bit_ = 3.0;
    }
    this->timer_count_ = this->timer_count_ + 2.0;
    dbg = 1;
    while (0.0 < this->timer_count_ - this->time_for_one_bit_ && 0 < dbg) {
      dbg = dbg + -1;
      this->timer_count_ = this->timer_count_ - this->time_for_one_bit_;
      this->new_bit_available_ = true;
      if ((this->read_ & 1U) == 0) {
        if ((this->sync_write_ & 1U) == 0) {
          local_1d = (bool)((byte)((int)(uint)this->byte_to_write_ >>
                                  (7U - (char)(this->write_bit_ >> 1) & 0x1f)) & 1);
          if ((this->write_bit_ & 1U) == 0) {
            if (local_1d == true) {
              local_1d = false;
            }
            else {
              local_1d = (this->current_mfm_byte_ & 1) != 1;
            }
          }
        }
        else {
          local_1d = (bool)((byte)((int)(uint)this->byte_to_write_ >>
                                  (0xfU - (char)this->write_bit_ & 0x1f)) & 1);
        }
        (*this->disk_->_vptr_IDisk[0xc])
                  (this->disk_,(ulong)(uint)this->current_side_,(ulong)this->current_track_,
                   (ulong)local_1d);
        this->current_mfm_byte_ = this->current_mfm_byte_ << 1;
        this->current_mfm_byte_ = this->current_mfm_byte_ | (ushort)local_1d;
        this->write_bit_ = this->write_bit_ + 1;
        if (this->write_bit_ == 0x10) {
          this->write_bit_ = 0;
          this->read_ = true;
        }
      }
      else {
        iVar2 = (*this->disk_->_vptr_IDisk[0xb])
                          (this->disk_,(ulong)(uint)this->current_side_,(ulong)this->current_track_)
        ;
        b_1 = (uchar)iVar2;
        if (this->encode_scheme_ == CODE_FM) {
          iVar2 = rand();
          b_1 = (byte)iVar2 & 1 | b_1 & 2;
        }
        this->on_index_hole_ = (b_1 & 2) == 2;
        this->current_mfm_byte_ = this->current_mfm_byte_ << 1;
        this->current_mfm_byte_ = this->current_mfm_byte_ | b_1 & 1;
        local_2e = true;
        if (this->current_mfm_byte_ != sync_seq_short1) {
          local_2e = this->current_mfm_byte_ == sync_seq_short2;
        }
        this->sync_found_ = local_2e;
      }
      this->data_bit_ = (bool)((this->data_bit_ ^ 0xffU) & 1);
    }
  }
  return;
}

Assistant:

void DiskGen::Tick()
{
   if (!motor_on_)
   {
      // Check if Final speed is different from 0
      if (final_speed_ != SPEED_0)
      {
         motor_on_ = true;
         speed_change_counter_ = 0;
      }
   }

   if (disk_present_ && motor_on_)
   {
      // Do we have to change speed ?
      if (speed_change_counter_ == 0)
      {
         // Change every 100000 ticks (20 ms)
         speed_change_counter_ = SPEED_COUNTER; // 10000;

         if (current_speed_ < final_speed_)
         {
            current_speed_ = current_speed_ + SPEED_CHANGE/*m_FinalSpeed / NB_ROUND_SPEED_MAX*/;
            if (current_speed_ > final_speed_) current_speed_ = final_speed_;

            if (current_speed_ == SPEED_0) motor_on_ = false;
         }
         else
         {
            current_speed_ = current_speed_ - SPEED_CHANGE/*m_FinalSpeed / NB_ROUND_SPEED_MAX*/;
            if (current_speed_ < final_speed_) current_speed_ = final_speed_;

            // 0 ?
         }
         // Compute the "time for one bit"
         if (motor_on_)
            time_for_one_bit_ = ((float)current_speed_ / (float)disk_->GetSizeOfTrack(current_side_, current_track_));
      }
      else
      {
         --speed_change_counter_;
      }

      // Default value : if m_TimeForOneBit is too low, it's not used
      if (time_for_one_bit_ > 3) time_for_one_bit_ = 3;

      // Can we handle the next bit ?
      // Add the real time value
      timer_count_ += 2.0;
      // int nb_bit_read = m_bDataBit?2:1;
      int nb_bit_read = 1;

      // Remove the speed value
      while (timer_count_ - time_for_one_bit_ > 0 && nb_bit_read > 0)
      {
         --nb_bit_read;

         // To adjust !
         timer_count_ -= time_for_one_bit_;

         new_bit_available_ = true;
         if (read_)
         {
            // Get next single bit
            unsigned char b = disk_->GetNextBit(current_side_, current_track_);
            if (encode_scheme_ == CODE_FM)
            {
               // TODO : Not supported now
               b = (rand() & 0x1) | (b & BIT_INDEX);
            }


            // Index hole ?
            on_index_hole_ = ((b & BIT_INDEX) == BIT_INDEX);

            // Complete current byte
            current_mfm_byte_ <<= 1;
            current_mfm_byte_ |= (b & 0x1);

            if (((current_mfm_byte_ & 0xF) == 0)
               || ((current_mfm_byte_ & 0x3) == 3)
            )
            {
               int dbg = 1;
            }

            // If sync search on : compare
            sync_found_ = ((current_mfm_byte_ == sync_seq_short1)
               || (current_mfm_byte_ == sync_seq_short2)
            );
         }
         else
         {
            // Write !
            unsigned char b;
            if (!sync_write_)
            {
               b = ((byte_to_write_ >> (7 - (write_bit_ >> 1))) & 0x01);
               // If m_bWriteBit odd, write next data bit
               if ((write_bit_ & 0x1) == 0x0)
               {
                  // Otherwise, write clock
                  b = (b == 1) ? 0 : (((current_mfm_byte_ & 0x1) == 0x1) ? 0 : 1);
               }
            }
            else
            {
               b = byte_to_write_ >> (15 - write_bit_) & 0x01;
            }

            disk_->WriteBit(current_side_, current_track_, b);

            current_mfm_byte_ <<= 1;
            current_mfm_byte_ |= (b & 0x1);


            // Increase bit to write
            ++write_bit_;
            if (write_bit_ == 16)
            {
               write_bit_ = 0;
               read_ = true;
            }
         }

         data_bit_ = !data_bit_;
      }
   }
}